

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O2

FT_Error TT_Set_Var_Design(TT_Face face,FT_UInt num_coords,FT_Fixed *coords)

{
  FT_Memory memory;
  ulong uVar1;
  long lVar2;
  uint num_coords_00;
  bool bVar3;
  long *plVar4;
  FT_Fixed *pFVar5;
  uint uVar6;
  GX_Blend pGVar7;
  long lVar8;
  long lVar9;
  FT_Error error;
  FT_MM_Var *local_40;
  uint local_34;
  
  error = 0;
  memory = (face->root).memory;
  pGVar7 = face->blend;
  if (pGVar7 == (GX_Blend)0x0) {
    pFVar5 = (FT_Fixed *)0x0;
    error = TT_Get_MM_Var(face,(FT_MM_Var **)0x0);
    if (error != 0) goto LAB_00215aca;
    pGVar7 = face->blend;
  }
  plVar4 = pGVar7->coords;
  local_40 = pGVar7->mmvar;
  uVar6 = local_40->num_axis;
  num_coords_00 = num_coords;
  if (uVar6 < num_coords) {
    num_coords_00 = uVar6;
  }
  if (plVar4 == (long *)0x0) {
    local_34 = num_coords_00;
    plVar4 = (long *)ft_mem_realloc(memory,8,0,(ulong)uVar6,(void *)0x0,&error);
    pFVar5 = (FT_Fixed *)0x0;
    pGVar7->coords = plVar4;
    num_coords_00 = local_34;
    if (error != 0) goto LAB_00215aca;
  }
  if ((ulong)uVar6 < (ulong)num_coords) {
    num_coords = uVar6;
  }
  bVar3 = false;
  for (lVar8 = 0; num_coords != (uint)lVar8; lVar8 = lVar8 + 1) {
    if (*plVar4 != coords[lVar8]) {
      *plVar4 = coords[lVar8];
      bVar3 = true;
    }
    plVar4 = plVar4 + 1;
  }
  uVar1 = (face->root).face_index;
  if ((uVar1 & 0x7fff0000) == 0) {
    uVar6 = local_40->num_axis;
    pFVar5 = &local_40->axis[num_coords_00].def;
    for (lVar8 = 0; num_coords_00 + (int)lVar8 < uVar6; lVar8 = lVar8 + 1) {
      if (plVar4[lVar8] != *pFVar5) {
        plVar4[lVar8] = *pFVar5;
        bVar3 = true;
      }
      pFVar5 = pFVar5 + 6;
    }
  }
  else {
    lVar8 = *(long *)((long)&local_40->namedstyle[-1].coords +
                     (ulong)((uint)uVar1 >> 0xc & 0xfffffff0));
    uVar6 = local_40->num_axis;
    for (lVar9 = 0; num_coords_00 + (int)lVar9 < uVar6; lVar9 = lVar9 + 1) {
      lVar2 = *(long *)((ulong)num_coords_00 * 8 + lVar8 + lVar9 * 8);
      if (plVar4[lVar9] != lVar2) {
        plVar4[lVar9] = lVar2;
        bVar3 = true;
      }
    }
  }
  if (!bVar3 && pGVar7->normalizedcoords != (FT_Fixed *)0x0) {
    return -1;
  }
  pFVar5 = (FT_Fixed *)ft_mem_realloc(memory,8,0,(ulong)uVar6,(void *)0x0,&error);
  if (error == 0) {
    if (face->blend->avar_loaded == '\0') {
      ft_var_load_avar(face);
    }
    ft_var_to_normalized(face,num_coords_00,pGVar7->coords,pFVar5);
    error = tt_set_mm_blend(face,local_40->num_axis,pFVar5,'\0');
    if (error == 0) {
      (face->root).face_flags =
           (ulong)(num_coords_00 != 0) << 0xf | (face->root).face_flags & 0xffffffffffff7fffU;
    }
  }
LAB_00215aca:
  ft_mem_free(memory,pFVar5);
  return error;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  TT_Set_Var_Design( TT_Face    face,
                     FT_UInt    num_coords,
                     FT_Fixed*  coords )
  {
    FT_Error    error  = FT_Err_Ok;
    GX_Blend    blend;
    FT_MM_Var*  mmvar;
    FT_UInt     i;
    FT_Memory   memory = face->root.memory;

    FT_Fixed*  c;
    FT_Fixed*  n;
    FT_Fixed*  normalized = NULL;

    FT_Bool  have_diff = 0;


    if ( !face->blend )
    {
      if ( FT_SET_ERROR( TT_Get_MM_Var( face, NULL ) ) )
        goto Exit;
    }

    blend = face->blend;
    mmvar = blend->mmvar;

    if ( num_coords > mmvar->num_axis )
    {
      FT_TRACE2(( "TT_Set_Var_Design:"
                  " only using first %d of %d coordinates\n",
                  mmvar->num_axis, num_coords ));
      num_coords = mmvar->num_axis;
    }

    if ( !blend->coords )
    {
      if ( FT_NEW_ARRAY( blend->coords, mmvar->num_axis ) )
        goto Exit;
    }

    c = blend->coords;
    n = coords;
    for ( i = 0; i < num_coords; i++, n++, c++ )
    {
      if ( *c != *n )
      {
        *c        = *n;
        have_diff = 1;
      }
    }

    if ( FT_IS_NAMED_INSTANCE( FT_FACE( face ) ) )
    {
      FT_UInt              instance_index;
      FT_Var_Named_Style*  named_style;


      instance_index = (FT_UInt)face->root.face_index >> 16;
      named_style    = mmvar->namedstyle + instance_index - 1;

      n = named_style->coords + num_coords;
      for ( ; i < mmvar->num_axis; i++, n++, c++ )
      {
        if ( *c != *n )
        {
          *c        = *n;
          have_diff = 1;
        }
      }
    }
    else
    {
      FT_Var_Axis*  a;


      a = mmvar->axis + num_coords;
      for ( ; i < mmvar->num_axis; i++, a++, c++ )
      {
        if ( *c != a->def )
        {
          *c        = a->def;
          have_diff = 1;
        }
      }
    }

    /* return value -1 indicates `no change';                      */
    /* we can exit early if `normalizedcoords' is already computed */
    if ( blend->normalizedcoords && !have_diff )
      return -1;

    if ( FT_NEW_ARRAY( normalized, mmvar->num_axis ) )
      goto Exit;

    if ( !face->blend->avar_loaded )
      ft_var_load_avar( face );

    FT_TRACE5(( "TT_Set_Var_Design:\n" ));
    FT_TRACE5(( "  normalized design coordinates:\n" ));
    ft_var_to_normalized( face, num_coords, blend->coords, normalized );

    error = tt_set_mm_blend( face, mmvar->num_axis, normalized, 0 );
    if ( error )
      goto Exit;

    if ( num_coords )
      face->root.face_flags |= FT_FACE_FLAG_VARIATION;
    else
      face->root.face_flags &= ~FT_FACE_FLAG_VARIATION;

  Exit:
    FT_FREE( normalized );
    return error;
  }